

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

Instr * __thiscall LowererMDArch::LowerEntryInstr(LowererMDArch *this,EntryInstr *entryInstr)

{
  IRType type;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  uint32 size;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  IndirOpnd *dstOpnd;
  Instr *pIVar10;
  JITTimeFunctionBody *this_00;
  Instr *pIVar11;
  Opnd *pOVar12;
  Opnd *src1Opnd;
  Instr *instr;
  StackSym *sym;
  SymOpnd *dstOpnd_00;
  Instr *pIVar13;
  PragmaInstr *pPVar14;
  undefined8 uVar15;
  uint uVar16;
  uint32 size_00;
  RegNum reg;
  long lVar17;
  uint uVar18;
  int offset;
  int iVar19;
  undefined4 *local_38;
  
  pIVar13 = (entryInstr->super_Instr).m_next;
  if (pIVar13 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x639,"(secondInstr)","Instruction chain broken.");
    if (!bVar3) goto LAB_005cec50;
    *local_38 = 0;
  }
  else {
    local_38 = (undefined4 *)__tls_get_addr();
  }
  offset = 0;
  pRVar8 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  iVar7 = 0;
  for (lVar17 = 1; lVar17 != 0x21; lVar17 = lVar17 + 1) {
    bVar3 = LinearScan::IsCalleeSaved((RegNum)lVar17);
    if ((bVar3) &&
       ((BVar6 = Func::HasTry(this->m_func), BVar6 != 0 ||
        (BVar4 = BVUnitT<unsigned_long>::Test(&this->m_func->m_regsUsed,(BVIndex)lVar17),
        BVar4 != '\0')))) {
      type = RegTypes[lVar17];
      pRVar9 = IR::RegOpnd::New((StackSym *)0x0,(RegNum)lVar17,type,this->m_func);
      if (type != TyInt64) {
        if (type == TyFloat64) {
          dstOpnd = IR::IndirOpnd::New(pRVar8,offset,TyFloat64,this->m_func,false);
          pIVar10 = IR::Instr::New(MOVAPS,&dstOpnd->super_Opnd,&pRVar9->super_Opnd,this->m_func);
          offset = offset + 0x10;
          IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar10);
          goto LAB_005ce7a5;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x658,"(type == TyInt64)","type == TyInt64");
        if (!bVar3) goto LAB_005cec50;
        *local_38 = 0;
      }
      pIVar10 = IR::Instr::New(PUSH,this->m_func);
      IR::Instr::SetSrc1(pIVar10,&pRVar9->super_Opnd);
      IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar10);
      iVar7 = iVar7 + 8;
    }
LAB_005ce7a5:
  }
  uVar16 = this->m_func->m_argSlotsForFunctionsCalled;
  bVar3 = Lowerer::IsArgSaveRequired(this->m_func);
  if (bVar3) {
    uVar18 = 6;
    if (6 < uVar16) {
      uVar18 = uVar16;
    }
    iVar19 = uVar18 * 8 + 8;
  }
  else {
    iVar19 = 8;
  }
  pFVar1 = this->m_func;
  uVar16 = pFVar1->m_localStackHeight + 7U & 0xfffffff8;
  uVar18 = pFVar1->maxInlineeArgOutSize + uVar16 + 8;
  uVar16 = offset + pFVar1->maxInlineeArgOutSize + uVar16 + 0x17 & 0xfffffff0;
  if (offset == 0) {
    uVar16 = uVar18;
  }
  pFVar1->m_localStackHeight = uVar18;
  uVar18 = iVar7 + iVar19 + uVar16;
  if ((uVar18 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x688,"(0 == (totalStackSize % 8))","Stack should always be 8 byte aligned")
    ;
    if (!bVar3) goto LAB_005cec50;
    *local_38 = 0;
  }
  bVar3 = (uVar18 & 0xf) != 0;
  size = iVar19 + (uint)bVar3 * 8;
  if ((offset != 0) && ((iVar7 + size + 0xf & 0xfffffff0) != size + iVar7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_38 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x68e,
                       "(xmmOffset == 0 || ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize)"
                       ,
                       "xmmOffset == 0 || ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize"
                      );
    if (!bVar5) goto LAB_005cec50;
    *local_38 = 0;
  }
  if (0x100000 < (uint)bVar3 * 8 + uVar18) {
    uVar15 = __cxa_allocate_exception(1);
    __cxa_throw(uVar15,&Js::OperationAbortedException::typeinfo,0);
  }
  bVar3 = Func::HasInlinee(this->m_func);
  if (bVar3) {
    JITOutput::SetFrameHeight(&this->m_func->m_output,this->m_func->m_localStackHeight);
  }
  pFVar1 = this->m_func;
  pFVar1->m_argsSize = size;
  pFVar1->m_savedRegSize = iVar7;
  pFVar1->m_spillSize = uVar16;
  if (pIVar13 == (entryInstr->super_Instr).m_next) {
    pIVar10 = pIVar13->m_prev;
    size_00 = size + uVar16;
LAB_005ce960:
    GenerateStackAllocation(this,pIVar10,size_00);
  }
  else {
    GenerateStackAllocation(this,pIVar13->m_prev,size);
    pIVar10 = &entryInstr->super_Instr;
    size_00 = uVar16;
    if (uVar16 != 0) goto LAB_005ce960;
  }
  pIVar10 = pIVar13->m_prev;
  if (pIVar10 == &entryInstr->super_Instr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x6bc,"(lastPrologInstr != entryInstr)","lastPrologInstr != entryInstr");
    if (!bVar3) {
LAB_005cec50:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_38 = 0;
  }
  bVar3 = Func::HasArgumentSlot(this->m_func);
  if (bVar3) {
    bVar3 = Func::IsStackArgsEnabled(this->m_func);
    if ((!bVar3) && (bVar3 = Func::IsJitInDebugMode(this->m_func), !bVar3)) {
      this_00 = Func::GetJITFunctionBody(this->m_func);
      bVar3 = JITTimeFunctionBody::IsInlineApplyDisabled(this_00);
      if (!bVar3) goto LAB_005ce9f1;
    }
  }
  else {
LAB_005ce9f1:
    bVar3 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutFlag);
    if ((((!bVar3) &&
         (bVar3 = Js::ConfigFlagsTable::IsEnabled
                            ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutAtEveryLineFlag),
         !bVar3)) &&
        (bVar3 = Js::ConfigFlagsTable::IsEnabled
                           ((ConfigFlagsTable *)&Js::Configuration::Global,
                            BailOutAtEveryByteCodeFlag), !bVar3)) &&
       (bVar3 = Js::ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutByteCodeFlag),
       !bVar3)) {
      bVar3 = true;
      pRVar8 = (RegOpnd *)0x0;
      goto LAB_005ceabc;
    }
  }
  pRVar8 = IR::RegOpnd::New((StackSym *)0x0,RegRAX,TyUint32,this->m_func);
  pIVar11 = IR::Instr::New(XOR,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pRVar8->super_Opnd,
                           this->m_func);
  IR::Instr::InsertAfter(pIVar13->m_prev,pIVar11);
  pOVar12 = LowererMD::CreateStackArgumentsSlotOpnd(this->m_func);
  src1Opnd = IR::Opnd::UseWithNewType(&pRVar8->super_Opnd,TyInt64,this->m_func);
  instr = IR::Instr::New(MOV,pOVar12,src1Opnd,this->m_func);
  IR::Instr::InsertAfter(pIVar13->m_prev,instr);
  bVar3 = pIVar11 == (Instr *)0x0;
LAB_005ceabc:
  bVar5 = Func::HasInlinee(this->m_func);
  if (bVar5) {
    if (bVar3) {
      pRVar8 = IR::RegOpnd::New((StackSym *)0x0,RegRAX,TyUint32,this->m_func);
      pIVar11 = IR::Instr::New(XOR,&pRVar8->super_Opnd,&pRVar8->super_Opnd,&pRVar8->super_Opnd,
                               this->m_func);
      IR::Instr::InsertAfter(pIVar13->m_prev,pIVar11);
    }
    sym = SymTable::GetArgSlotSym(this->m_func->m_symTable,0xffff);
    sym->field_0x19 = sym->field_0x19 | 0x40;
    sym->m_offset = 0;
    dstOpnd_00 = IR::SymOpnd::New(&sym->super_Sym,0,TyInt64,this->m_func);
    pIVar13 = pIVar13->m_prev;
    pOVar12 = IR::Opnd::UseWithNewType(&pRVar8->super_Opnd,TyInt64,this->m_func);
    pIVar11 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,pOVar12,this->m_func);
    IR::Instr::InsertAfter(pIVar13,pIVar11);
  }
  pRVar8 = IR::RegOpnd::New((StackSym *)0x0,RegRBP,TyInt64,this->m_func);
  pRVar9 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  pIVar13 = IR::Instr::New(MOV,&pRVar8->super_Opnd,&pRVar9->super_Opnd,this->m_func);
  IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar13);
  pIVar13 = IR::Instr::New(PUSH,this->m_func);
  IR::Instr::SetSrc1(pIVar13,&pRVar8->super_Opnd);
  IR::Instr::InsertAfter(&entryInstr->super_Instr,pIVar13);
  pPVar14 = IR::PragmaInstr::New(PrologStart,0,this->m_func);
  IR::Instr::InsertBefore(pIVar13,&pPVar14->super_Instr);
  pPVar14 = IR::PragmaInstr::New(PrologEnd,0,this->m_func);
  IR::Instr::InsertAfter(pIVar10,&pPVar14->super_Instr);
  GeneratePrologueStackProbe(this,&entryInstr->super_Instr,(ulong)(size + iVar7 + uVar16 + 0x1b90));
  return &entryInstr->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerEntryInstr(IR::EntryInstr * entryInstr)
{
    /*
     * push   rbp
     * mov    rbp,                       rsp
     * sub    rsp,                       localVariablesHeight + floatCalleeSavedRegsSize
     * movsdx qword ptr [rsp + 0],       xmm6  ------\
     * movsdx qword ptr [rsp + 8],       xmm7        |
     * ...                                           |
     * movsdx qword ptr [rsp + (N * 8)], xmmN        |- Callee saved registers.
     * push   rsi                                    |
     * ...                                           |
     * push   rbx                              ------/
     * sub    rsp,                       ArgumentsBacking
     */

    uint savedRegSize           = 0;
    IR::Instr *firstPrologInstr = nullptr;
    IR::Instr *lastPrologInstr  = nullptr;

    // PUSH used callee-saved registers.
    IR::Instr *secondInstr      = entryInstr->m_next;
    AssertMsg(secondInstr, "Instruction chain broken.");

    IR::RegOpnd *stackPointer   = IR::RegOpnd::New(nullptr, GetRegStackPointer(), TyMachReg, this->m_func);
    unsigned     xmmOffset      = 0;

    // PDATA doesn't seem to like two consecutive "SUB RSP, size" instructions. Temporarily save and
    // restore RBX always so that the pattern doesn't occur in the prolog.
    for (RegNum reg = (RegNum)(RegNOREG + 1); reg < RegNumCount; reg = (RegNum)(reg + 1))
    {
        if (LinearScan::IsCalleeSaved(reg) && (this->m_func->HasTry() || this->m_func->m_regsUsed.Test(reg)))
        {
            IRType       type      = RegTypes[reg];
            IR::RegOpnd *regOpnd   = IR::RegOpnd::New(nullptr, reg, type, this->m_func);

            if (type == TyFloat64)
            {
                IR::Instr *saveInstr = IR::Instr::New(Js::OpCode::MOVAPS,
                                                      IR::IndirOpnd::New(stackPointer,
                                                                         xmmOffset,
                                                                         type,
                                                                         this->m_func),
                                                      regOpnd,
                                                      this->m_func);

                xmmOffset += (MachDouble * 2);
                entryInstr->InsertAfter(saveInstr);

                m_func->m_prologEncoder.RecordXmmRegSave();
            }
            else
            {
                Assert(type == TyInt64);

                IR::Instr *pushInstr = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
                pushInstr->SetSrc1(regOpnd);
                entryInstr->InsertAfter(pushInstr);

                m_func->m_prologEncoder.RecordNonVolRegSave();
                savedRegSize += MachPtr;
            }
        }
    }
    //
    // Now that we know the exact stack size, lets fix it for alignment
    // The stack on entry would be aligned. VC++ recommends that the stack
    // should always be 16 byte aligned.
    //
    uint32 argSlotsForFunctionsCalled = this->m_func->m_argSlotsForFunctionsCalled;

    if (Lowerer::IsArgSaveRequired(this->m_func))
    {
        if (argSlotsForFunctionsCalled < IntArgRegsCount)
            argSlotsForFunctionsCalled = IntArgRegsCount;
    }
    else
    {
        argSlotsForFunctionsCalled = 0;
    }

    uint32 stackArgsSize    = MachPtr * (argSlotsForFunctionsCalled + 1);

    this->m_func->m_localStackHeight = Math::Align<int32>(this->m_func->m_localStackHeight, 8);

    // Allocate the inlined arg out stack in the locals. Allocate an additional slot so that
    // we can unconditionally clear the first slot past the current frame.
    this->m_func->m_localStackHeight += m_func->GetMaxInlineeArgOutSize() + MachPtr;

    uint32 stackLocalsSize  = this->m_func->m_localStackHeight;
    if(xmmOffset != 0)
    {
        // Xmm registers need to be saved to 16-byte-aligned addresses. The stack locals size is aligned here and the total
        // size will be aligned below, which guarantees that the offset from rsp will be 16-byte-aligned.
        stackLocalsSize = ::Math::Align(stackLocalsSize + xmmOffset, static_cast<uint32>(MachDouble * 2));
    }

    uint32 totalStackSize   = stackLocalsSize +
                              stackArgsSize   +
                              savedRegSize;

    AssertMsg(0 == (totalStackSize % 8), "Stack should always be 8 byte aligned");
    uint32 alignmentPadding = (totalStackSize % 16) ? MachPtr : 0;

    stackArgsSize += alignmentPadding;
    Assert(
        xmmOffset == 0 ||
        ::Math::Align(stackArgsSize + savedRegSize, static_cast<uint32>(MachDouble * 2)) == stackArgsSize + savedRegSize);

    totalStackSize += alignmentPadding;
    if(totalStackSize > (1u << 20)) // 1 MB
    {
        // Total stack size is > 1 MB, let's just bail. There are things that need to be changed to allow using large stack
        // sizes, for instance in the unwind info, the offset to saved xmm registers can be (1 MB - 16) at most for the op-code
        // we're currently using (UWOP_SAVE_XMM128). To support larger offsets, we need to use a FAR version of the op-code.
        throw Js::OperationAbortedException();
    }

    if (m_func->HasInlinee())
    {
        this->m_func->GetJITOutput()->SetFrameHeight(this->m_func->m_localStackHeight);
    }

    //
    // This is the last instruction so should have been emitted before, register saves.
    // But we did not have 'savedRegSize' by then. So we saved secondInstr. We now insert w.r.t that
    // instruction.
    //
    this->m_func->SetArgsSize(stackArgsSize);
    this->m_func->SetSavedRegSize(savedRegSize);
    this->m_func->SetSpillSize(stackLocalsSize);

    if (secondInstr == entryInstr->m_next)
    {
        // There is no register save at all, just combine the stack allocation
        uint combineStackAllocationSize = stackArgsSize + stackLocalsSize;
        this->GenerateStackAllocation(secondInstr->m_prev, combineStackAllocationSize);
        m_func->m_prologEncoder.RecordAlloca(combineStackAllocationSize);
    }
    else
    {
        this->GenerateStackAllocation(secondInstr->m_prev, stackArgsSize);
        m_func->m_prologEncoder.RecordAlloca(stackArgsSize);

        // Allocate frame.
        if (stackLocalsSize)
        {
            this->GenerateStackAllocation(entryInstr, stackLocalsSize);
            m_func->m_prologEncoder.RecordAlloca(stackLocalsSize);
        }
    }

    lastPrologInstr = secondInstr->m_prev;
    Assert(lastPrologInstr != entryInstr);

    // Zero-initialize dedicated arguments slot.
    IR::Instr *movRax0 = nullptr;
    IR::Opnd *raxOpnd = nullptr;

    if ((this->m_func->HasArgumentSlot() &&
            (this->m_func->IsStackArgsEnabled() ||
            this->m_func->IsJitInDebugMode() ||
            // disabling apply inlining leads to explicit load from the zero-inited slot
            this->m_func->GetJITFunctionBody()->IsInlineApplyDisabled()))
#ifdef BAILOUT_INJECTION
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryLineFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag)
        || Js::Configuration::Global.flags.IsEnabled(Js::BailOutByteCodeFlag)
#endif
        )
    {
        // TODO: Support mov [rbp - n], IMM64
        raxOpnd = IR::RegOpnd::New(nullptr, RegRAX, TyUint32, this->m_func);
        movRax0 = IR::Instr::New(Js::OpCode::XOR, raxOpnd, raxOpnd, raxOpnd, this->m_func);
        secondInstr->m_prev->InsertAfter(movRax0);

        IR::Opnd *opnd = LowererMD::CreateStackArgumentsSlotOpnd(this->m_func);
        IR::Instr *movNullInstr = IR::Instr::New(Js::OpCode::MOV, opnd, raxOpnd->UseWithNewType(TyMachReg, this->m_func), this->m_func);
        secondInstr->m_prev->InsertAfter(movNullInstr);
    }

    // Zero initialize the first inlinee frames argc.
    if (m_func->HasInlinee())
    {
        if(!movRax0)
        {
            raxOpnd = IR::RegOpnd::New(nullptr, RegRAX, TyUint32, this->m_func);
            movRax0 = IR::Instr::New(Js::OpCode::XOR, raxOpnd, raxOpnd, raxOpnd, this->m_func);
            secondInstr->m_prev->InsertAfter(movRax0);
        }

        StackSym *sym           = this->m_func->m_symTable->GetArgSlotSym((Js::ArgSlot)-1);
        sym->m_isInlinedArgSlot = true;
        sym->m_offset           = 0;
        IR::Opnd *dst           = IR::SymOpnd::New(sym, 0, TyMachReg, this->m_func);
        secondInstr->m_prev->InsertAfter(IR::Instr::New(Js::OpCode::MOV,
                                                        dst,
                                                        raxOpnd->UseWithNewType(TyMachReg, this->m_func),
                                                        this->m_func));
    }

    // Generate MOV RBP, RSP
    IR::RegOpnd * rbpOpnd = IR::RegOpnd::New(nullptr, RegRBP, TyMachReg, this->m_func);
    IR::RegOpnd * rspOpnd = IR::RegOpnd::New(nullptr, RegRSP, TyMachReg, this->m_func);

    IR::Instr * movInstr = IR::Instr::New(Js::OpCode::MOV, rbpOpnd, rspOpnd, this->m_func);
    entryInstr->InsertAfter(movInstr);

    // Generate PUSH RBP
    IR::Instr * pushInstr = IR::Instr::New(Js::OpCode::PUSH, this->m_func);
    pushInstr->SetSrc1(rbpOpnd);
    entryInstr->InsertAfter(pushInstr);
    m_func->m_prologEncoder.RecordNonVolRegSave();
    firstPrologInstr = pushInstr;


    //
    // Insert pragmas that tell the prolog encoder the extent of the prolog.
    //
    firstPrologInstr->InsertBefore(IR::PragmaInstr::New(Js::OpCode::PrologStart, 0, m_func));
    lastPrologInstr->InsertAfter(IR::PragmaInstr::New(Js::OpCode::PrologEnd, 0, m_func));

#ifdef _WIN32 // home registers
    //
    // Now store all the arguments in the register in the stack slots
    //
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody())
    {
        uint16 offset = 2;
        this->MovArgFromReg2Stack(entryInstr, RegRCX, 1);
        for (uint16 i = 0; i < m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetArgCount() && i < 3; i++)
        {
            switch (m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetArgType(i))
            {
            case Js::AsmJsVarType::Int:
                this->MovArgFromReg2Stack(entryInstr, i == 0 ? RegRDX : i == 1 ? RegR8 : RegR9, offset, TyInt32);
                offset++;
                break;
            case Js::AsmJsVarType::Int64:
                this->MovArgFromReg2Stack(entryInstr, i == 0 ? RegRDX : i == 1 ? RegR8 : RegR9, offset, TyInt64);
                offset++;
                break;
            case Js::AsmJsVarType::Float:
                // registers we need are contiguous, so calculate it from XMM1
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TyFloat32);
                offset++;
                break;
            case Js::AsmJsVarType::Double:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TyFloat64);
                offset++;
                break;
            case Js::AsmJsVarType::Float32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128F4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Uint8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128U16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool32x4:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B4);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool16x8:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B8);
                offset += 2;
                break;
            case Js::AsmJsVarType::Bool8x16:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128B16);
                offset += 2;
                break;
            case Js::AsmJsVarType::Float64x2:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128D2);
                offset += 2;
                break;
            case Js::AsmJsVarType::Int64x2:
                this->MovArgFromReg2Stack(entryInstr, (RegNum)(RegXMM1 + i), offset, TySimd128I2);
                offset += 2;
                break;
            default:
                Assume(UNREACHED);
            }
        }
    }
    else if (argSlotsForFunctionsCalled)
    {
        this->MovArgFromReg2Stack(entryInstr, RegRCX, 1);
        this->MovArgFromReg2Stack(entryInstr, RegRDX, 2);
        this->MovArgFromReg2Stack(entryInstr, RegR8, 3);
        this->MovArgFromReg2Stack(entryInstr, RegR9, 4);
    }
#endif  // _WIN32

    IntConstType frameSize = Js::Constants::MinStackJIT + stackArgsSize + stackLocalsSize + savedRegSize;
    this->GeneratePrologueStackProbe(entryInstr, frameSize);

    return entryInstr;
}